

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

string * __thiscall
cmLocalUnixMakefileGenerator3::MaybeConvertToRelativePath
          (string *__return_storage_ptr__,cmLocalUnixMakefileGenerator3 *this,string *base,
          string *path)

{
  bool bVar1;
  cmStateSnapshot cStack_68;
  cmStateDirectory local_50;
  
  cmLocalGenerator::GetStateSnapshot(&cStack_68,(cmLocalGenerator *)this);
  cmStateSnapshot::GetDirectory(&local_50,&cStack_68);
  bVar1 = cmOutputConverter::ContainedInDirectory(base,path,&local_50);
  if (bVar1) {
    cmOutputConverter::ForceToRelativePath(__return_storage_ptr__,base,path);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)path);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalUnixMakefileGenerator3::MaybeConvertToRelativePath(
  std::string const& base, std::string const& path)
{
  if (!cmOutputConverter::ContainedInDirectory(
        base, path, this->GetStateSnapshot().GetDirectory())) {
    return path;
  }
  return cmOutputConverter::ForceToRelativePath(base, path);
}